

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_lookup_type_op(sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp id)

{
  sexp psVar1;
  sexp psVar2;
  bool bVar3;
  int iVar4;
  sexp psVar5;
  long lVar6;
  uint uVar7;
  char *__s1;
  long lVar8;
  
  if ((((ulong)name & 3) != 0) || (name->tag != 9)) {
    psVar5 = sexp_type_exception(ctx,self,9,name);
    return psVar5;
  }
  __s1 = (((name->value).type.cpl)->value).flonum_bits +
         (long)(((name->value).type.name)->value).flonum_bits;
  if (((ulong)id & 1) == 0) {
    psVar5 = (ctx->value).type.setters;
    uVar7 = (int)((ulong)(psVar5->value).type.id >> 1) - 1;
    if (-1 < (int)uVar7) {
      psVar5 = (psVar5->value).type.getters;
      lVar6 = (ulong)uVar7 + 1;
      do {
        psVar1 = *(sexp *)((long)&psVar5->value + lVar6 * 8);
        psVar2 = (psVar1->value).type.name;
        iVar4 = strcmp(__s1,(((psVar2->value).type.cpl)->value).flonum_bits +
                            (long)(((psVar2->value).type.name)->value).flonum_bits);
        if (iVar4 == 0) {
          if (((ulong)id & 2) != 0) {
            return psVar1;
          }
          if (id->tag != 9) {
            return psVar1;
          }
          psVar2 = (psVar1->value).type.id;
          if (((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 9)) &&
             (iVar4 = strcmp((((id->value).type.cpl)->value).flonum_bits +
                             (long)(((id->value).type.name)->value).flonum_bits,
                             (((psVar2->value).type.cpl)->value).flonum_bits +
                             (long)(((psVar2->value).type.name)->value).flonum_bits), iVar4 == 0)) {
            return psVar1;
          }
        }
        lVar8 = lVar6 + -1;
        bVar3 = 0 < lVar6;
        lVar6 = lVar8;
      } while (lVar8 != 0 && bVar3);
    }
  }
  else {
    lVar6 = (long)(int)((ulong)id >> 1);
    psVar5 = (ctx->value).type.setters;
    if (lVar6 < (long)(psVar5->value).type.id >> 1) {
      psVar5 = *(sexp *)((long)&((psVar5->value).type.getters)->value + lVar6 * 8 + 8);
      psVar1 = (psVar5->value).type.name;
      iVar4 = strcmp(__s1,(((psVar1->value).type.cpl)->value).flonum_bits +
                          (long)(((psVar1->value).type.name)->value).flonum_bits);
      if (iVar4 == 0) {
        return psVar5;
      }
    }
  }
  return (sexp)&DAT_0000003e;
}

Assistant:

sexp sexp_lookup_type_op(sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp id) {
  int i;
  sexp res;
  const char* str;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, name);
  str = sexp_string_data(name);
  if (sexp_fixnump(id)) {
    i = sexp_unbox_fixnum(id);
    if (i < sexp_context_num_types(ctx)
        && strcmp(str, sexp_string_data(sexp_type_name_by_index(ctx, i))) == 0)
      return sexp_type_by_index(ctx, i);
    else
      return SEXP_FALSE;
  }
  for (i=sexp_context_num_types(ctx)-1; i>=0; i--)
    if (strcmp(str, sexp_string_data(sexp_type_name_by_index(ctx, i))) == 0) {
      res = sexp_type_by_index(ctx, i);
      if (sexp_stringp(id)
          && !(sexp_stringp(sexp_type_id(res))
               && strcmp(sexp_string_data(id), sexp_string_data(sexp_type_id(res))) == 0))
        continue;
      return res;
    }
  return SEXP_FALSE;
}